

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void dr_prediction_z1_32xN_avx2
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  uint8_t uVar1;
  ulong uVar2;
  ushort uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined1 (*pauVar8) [32];
  int iVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [32];
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [32];
  ushort uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  __m256i dstvec [64];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined8 local_860 [262];
  undefined1 auVar17 [32];
  
  uVar2 = (ulong)(uint)N;
  if (0 < N) {
    uVar1 = above[(long)N + 0x1f];
    auVar16[1] = uVar1;
    auVar16[0] = uVar1;
    auVar16[2] = uVar1;
    auVar16[3] = uVar1;
    auVar16[4] = uVar1;
    auVar16[5] = uVar1;
    auVar16[6] = uVar1;
    auVar16[7] = uVar1;
    auVar16[8] = uVar1;
    auVar16[9] = uVar1;
    auVar16[10] = uVar1;
    auVar16[0xb] = uVar1;
    auVar16[0xc] = uVar1;
    auVar16[0xd] = uVar1;
    auVar16[0xe] = uVar1;
    auVar16[0xf] = uVar1;
    auVar17[0x10] = uVar1;
    auVar17._0_16_ = auVar16;
    auVar17[0x11] = uVar1;
    auVar17[0x12] = uVar1;
    auVar17[0x13] = uVar1;
    auVar17[0x14] = uVar1;
    auVar17[0x15] = uVar1;
    auVar17[0x16] = uVar1;
    auVar17[0x17] = uVar1;
    auVar17[0x18] = uVar1;
    auVar17[0x19] = uVar1;
    auVar17[0x1a] = uVar1;
    auVar17[0x1b] = uVar1;
    auVar17[0x1c] = uVar1;
    auVar17[0x1d] = uVar1;
    auVar17[0x1e] = uVar1;
    auVar17[0x1f] = uVar1;
    pauVar11 = (undefined1 (*) [32])local_860;
    auVar18._8_2_ = 0x10;
    auVar18._0_8_ = 0x10001000100010;
    auVar18._10_2_ = 0x10;
    auVar18._12_2_ = 0x10;
    auVar18._14_2_ = 0x10;
    auVar18._16_2_ = 0x10;
    auVar18._18_2_ = 0x10;
    auVar18._20_2_ = 0x10;
    auVar18._22_2_ = 0x10;
    auVar18._24_2_ = 0x10;
    auVar18._26_2_ = 0x10;
    auVar18._28_2_ = 0x10;
    auVar18._30_2_ = 0x10;
    uVar12 = 0;
    uVar14 = uVar2;
    uVar15 = upsample_above;
    do {
      iVar9 = (int)uVar15 >> 6;
      uVar13 = (N + 0x1f) - iVar9;
      pauVar8 = pauVar11;
      uVar10 = uVar14;
      if (uVar13 == 0 || N + 0x1f < iVar9) {
        do {
          *pauVar8 = auVar17;
          uVar10 = uVar10 - 1;
          pauVar8 = pauVar8 + 1;
        } while (uVar10 != 0);
      }
      else {
        uVar3 = (ushort)(uVar15 >> 1);
        uVar19 = uVar3 & 0x1f;
        auVar20._0_8_ = CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3,uVar3))) & 0x1f001f001f001f;
        auVar20._8_2_ = uVar19;
        auVar20._10_2_ = uVar19;
        auVar20._12_2_ = uVar19;
        auVar20._14_2_ = uVar19;
        auVar20._16_2_ = uVar19;
        auVar20._18_2_ = uVar19;
        auVar20._20_2_ = uVar19;
        auVar20._22_2_ = uVar19;
        auVar20._24_2_ = uVar19;
        auVar20._26_2_ = uVar19;
        auVar20._28_2_ = uVar19;
        auVar20._30_2_ = uVar19;
        uVar10 = 0;
        do {
          auVar21 = auVar17;
          if (uVar10 < uVar13) {
            auVar21 = vpmovzxbw_avx2(*(undefined1 (*) [16])(above + uVar10 + (long)iVar9));
            auVar22 = vpmovzxbw_avx2(*(undefined1 (*) [16])(above + uVar10 + (long)iVar9 + 1));
            auVar22 = vpsubw_avx2(auVar22,auVar21);
            auVar22 = vpmullw_avx2(auVar22,auVar20);
            auVar21 = vpsllw_avx2(auVar21,5);
            auVar21 = vpaddw_avx2(auVar21,auVar18);
            auVar21 = vpaddw_avx2(auVar22,auVar21);
            auVar21 = vpsrlw_avx2(auVar21,5);
            auVar22._0_16_ = ZEXT116(0) * auVar16 + ZEXT116(1) * auVar21._16_16_;
            auVar22._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar16;
            auVar21 = vpackuswb_avx2(auVar21,auVar22);
          }
          *(undefined1 (*) [32])(local_8a0 + uVar10 * 2) = auVar21;
          uVar10 = uVar10 + 0x10;
        } while (uVar10 == 0x10);
        uVar10 = 0x20;
        if ((int)uVar13 < 0x20) {
          uVar10 = (ulong)uVar13;
        }
        local_880 = vperm2i128_avx2(local_8a0,local_880,0x20);
        auVar20 = vpblendvb_avx2(auVar17,local_880,(undefined1  [32])BaseMask[uVar10]);
        *(undefined1 (*) [32])(local_860 + uVar12 * 4) = auVar20;
        uVar15 = uVar15 + upsample_above;
      }
      if ((int)uVar13 < 1) break;
      uVar12 = uVar12 + 1;
      pauVar11 = pauVar11 + 1;
      uVar14 = uVar14 - 1;
    } while (uVar12 != uVar2);
  }
  if (0 < N) {
    lVar7 = 0;
    do {
      uVar4 = *(undefined8 *)((long)local_860 + lVar7 + 8);
      uVar5 = *(undefined8 *)((long)local_860 + lVar7 + 0x10);
      uVar6 = *(undefined8 *)((long)local_860 + lVar7 + 0x18);
      *(undefined8 *)dst = *(undefined8 *)((long)local_860 + lVar7);
      *(undefined8 *)(dst + 8) = uVar4;
      *(undefined8 *)(dst + 0x10) = uVar5;
      *(undefined8 *)(dst + 0x18) = uVar6;
      lVar7 = lVar7 + 0x20;
      dst = dst + stride;
    } while (uVar2 << 5 != lVar7);
  }
  return;
}

Assistant:

static void dr_prediction_z1_32xN_avx2(int N, uint8_t *dst, ptrdiff_t stride,
                                       const uint8_t *above, int upsample_above,
                                       int dx) {
  __m256i dstvec[64];
  dr_prediction_z1_32xN_internal_avx2(N, dstvec, above, upsample_above, dx);
  for (int i = 0; i < N; i++) {
    _mm256_storeu_si256((__m256i *)(dst + stride * i), dstvec[i]);
  }
}